

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.h
# Opt level: O3

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSet<google::protobuf::Message>
          (ExtensionSet *this,char *ptr,Message *extendee,InternalMetadata *metadata,
          ParseContext *ctx)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  bool bVar6;
  uint res;
  int d;
  byte *pbVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  byte *local_60;
  ExtensionSet *local_58;
  Message *local_50;
  InternalMetadata *local_48;
  
  local_60 = (byte *)ptr;
  local_58 = this;
  local_50 = extendee;
  local_48 = metadata;
  bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                    (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
  if (!bVar6) {
    do {
      bVar3 = *local_60;
      res = (uint)bVar3;
      pbVar7 = local_60 + 1;
      if ((char)bVar3 < '\0') {
        res = ((uint)bVar3 + (uint)*pbVar7 * 0x80) - 0x80;
        if ((char)*pbVar7 < '\0') {
          pVar8 = ReadTagFallback((char *)local_60,res);
          res = pVar8.second;
          pbVar7 = (byte *)pVar8.first;
          if (pbVar7 == (byte *)0x0) {
            return (char *)0x0;
          }
        }
        else {
          pbVar7 = local_60 + 2;
        }
      }
      local_60 = pbVar7;
      if (res == 0xb) {
        iVar4 = ctx->depth_;
        ctx->depth_ = iVar4 + -1;
        if (iVar4 < 1) {
          return (char *)0x0;
        }
        d = ctx->group_depth_;
        ctx->group_depth_ = d + 1;
        pbVar7 = (byte *)ParseMessageSetItem(local_58,(char *)pbVar7,local_50,local_48,ctx);
        if (pbVar7 == (byte *)0x0) {
          uVar1 = ctx->depth_;
          uVar2 = ctx->group_depth_;
          ctx->depth_ = uVar1 + 1;
          ctx->group_depth_ = uVar2 + -1;
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
          return (char *)0x0;
        }
        if (iVar4 + -1 != ctx->depth_) {
          ParseMessageSet<google::protobuf::Message>();
LAB_00f71168:
          ParseMessageSet<google::protobuf::Message>();
        }
        if (d + 1 != ctx->group_depth_) goto LAB_00f71168;
        ctx->group_depth_ = d;
        ctx->depth_ = iVar4;
        uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
        local_60 = pbVar7;
        if (uVar5 != 0xb) {
          return (char *)0x0;
        }
      }
      else {
        if ((res == 0) || ((res & 7) == 4)) {
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar7;
        }
        local_60 = (byte *)ParseField(local_58,(ulong)res,(char *)pbVar7,local_50,local_48,ctx);
        if (local_60 == (byte *)0x0) {
          return (char *)0x0;
        }
        d = ctx->group_depth_;
      }
      bVar6 = EpsCopyInputStream::DoneWithCheck<false>
                        (&ctx->super_EpsCopyInputStream,(char **)&local_60,d);
    } while (!bVar6);
  }
  return (char *)local_60;
}

Assistant:

const char* ParseMessageSet(const char* ptr, const Msg* extendee,
                              InternalMetadata* metadata,
                              internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        ptr = ctx->ParseGroupInlined(ptr, tag, [&](const char* ptr) {
          return ParseMessageSetItem(ptr, extendee, metadata, ctx);
        });
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      } else {
        if (tag == 0 || (tag & 7) == 4) {
          ctx->SetLastTag(tag);
          return ptr;
        }
        ptr = ParseField(tag, ptr, extendee, metadata, ctx);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
      }
    }
    return ptr;
  }